

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeBuffer.cpp
# Opt level: O0

void __thiscall
cali::NodeBuffer::for_each(NodeBuffer *this,function<void_(const_cali::NodeBuffer::NodeInfo_&)> *fn)

{
  bool bVar1;
  NodeInfo local_50;
  ulong local_28;
  size_t i;
  size_t pos;
  function<void_(const_cali::NodeBuffer::NodeInfo_&)> *fn_local;
  NodeBuffer *this_local;
  
  i = 0;
  local_28 = 0;
  pos = (size_t)fn;
  fn_local = (function<void_(const_cali::NodeBuffer::NodeInfo_&)> *)this;
  while( true ) {
    bVar1 = false;
    if (local_28 < this->m_count) {
      bVar1 = i < this->m_pos;
    }
    if (!bVar1) break;
    anon_unknown.dwarf_15986::unpack_node(&local_50,this->m_buffer + i,&i);
    std::function<void_(const_cali::NodeBuffer::NodeInfo_&)>::operator()(fn,&local_50);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void NodeBuffer::for_each(const std::function<void(const NodeInfo&)> fn) const
{
    size_t pos = 0;

    for (size_t i = 0; i < m_count && pos < m_pos; ++i)
        fn(::unpack_node(m_buffer + pos, &pos));
}